

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBAAseparate16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (h != 0) {
    lVar3 = (long)fromskew;
    do {
      if (w != 0) {
        puVar1 = img->Bitdepth16To8;
        lVar4 = 0;
        lVar5 = 0;
        uVar2 = w;
        do {
          *(uint *)((long)cp + lVar5 * 2) =
               CONCAT13(puVar1[*(ushort *)(a + lVar5)],
                        CONCAT12(puVar1[*(ushort *)(b + lVar5)],
                                 CONCAT11(puVar1[*(ushort *)(g + lVar5)],
                                          puVar1[*(ushort *)(r + lVar5)])));
          lVar5 = lVar5 + 2;
          lVar4 = lVar4 + -4;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
        a = a + lVar5;
        b = b + lVar5;
        g = g + lVar5;
        r = r + lVar5;
        cp = (uint32_t *)((long)cp - lVar4);
      }
      r = r + lVar3 * 2;
      g = g + lVar3 * 2;
      b = b + lVar3 * 2;
      a = a + lVar3 * 2;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBAAseparate16bittile)
{
    uint16_t *wr = (uint16_t *)r;
    uint16_t *wg = (uint16_t *)g;
    uint16_t *wb = (uint16_t *)b;
    uint16_t *wa = (uint16_t *)a;
    (void)img;
    (void)y;
    for (; h > 0; --h)
    {
        for (x = 0; x < w; x++)
            *cp++ = PACK4(img->Bitdepth16To8[*wr++], img->Bitdepth16To8[*wg++],
                          img->Bitdepth16To8[*wb++], img->Bitdepth16To8[*wa++]);
        SKEW4(wr, wg, wb, wa, fromskew);
        cp += toskew;
    }
}